

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.h
# Opt level: O0

int nng_args_parse(int argc,char **argv,nng_arg_spec *specs,int *val,char **optarg,int *optidx)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  int local_60;
  int local_5c;
  int x;
  int i;
  char *arg;
  size_t l;
  _Bool shortopt;
  nng_arg_spec *pnStack_40;
  int matches;
  nng_arg_spec *spec;
  int *optidx_local;
  char **optarg_local;
  int *val_local;
  nng_arg_spec *specs_local;
  char **argv_local;
  int argc_local;
  
  local_5c = *optidx;
  if (local_5c < argc) {
    _x = argv[*optidx];
    if (*_x == '-') {
      if (_x[1] == '\0') {
        *optidx = local_5c + 1;
        argv_local._4_4_ = -1;
      }
      else {
        if ((*_x == '-') && (_x[1] == '-')) {
          _x = _x + 2;
          bVar1 = false;
          for (arg = (char *)0x0;
              ((_x[(long)arg] != '\0' && (_x[(long)arg] != '=')) && (_x[(long)arg] != ':'));
              arg = arg + 1) {
          }
        }
        else {
          _x = _x + 1;
          bVar1 = true;
          arg = (char *)0x1;
        }
        l._4_4_ = 0;
        pnStack_40 = (nng_arg_spec *)0x0;
        local_60 = 0;
        while (specs[local_60].a_val != 0) {
          if (bVar1) {
            if ((int)*_x == specs[local_60].a_short) {
              l._4_4_ = 1;
              pnStack_40 = specs + local_60;
              break;
            }
          }
          else if ((specs[local_60].a_name != (char *)0x0) &&
                  (iVar2 = strncmp(_x,specs[local_60].a_name,(size_t)arg), iVar2 == 0)) {
            l._4_4_ = l._4_4_ + 1;
            pnStack_40 = specs + local_60;
            pcVar3 = (char *)strlen(specs[local_60].a_name);
            if (pcVar3 == arg) {
              l._4_4_ = 1;
              break;
            }
          }
          local_60 = local_60 + 1;
        }
        if (l._4_4_ == 0) {
          argv_local._4_4_ = -2;
        }
        else if (l._4_4_ == 1) {
          if ((pnStack_40->a_arg & 1U) == 0) {
            if (_x[(long)arg] == '\0') {
              *val = pnStack_40->a_val;
              *optidx = local_5c + 1;
              argv_local._4_4_ = 0;
            }
            else {
              argv_local._4_4_ = -2;
            }
          }
          else {
            if (_x[(long)arg] == '\0') {
              local_5c = local_5c + 1;
              if (argc <= local_5c) {
                return -4;
              }
              *optarg = argv[local_5c];
            }
            else if (bVar1) {
              *optarg = _x + (long)arg;
            }
            else {
              *optarg = _x + (long)arg + 1;
            }
            *optidx = local_5c + 1;
            *val = pnStack_40->a_val;
            argv_local._4_4_ = 0;
          }
        }
        else {
          argv_local._4_4_ = -3;
        }
      }
    }
    else {
      argv_local._4_4_ = -1;
    }
  }
  else {
    argv_local._4_4_ = -1;
  }
  return argv_local._4_4_;
}

Assistant:

int
nng_args_parse(int argc, char *const *argv, const nng_arg_spec *specs,
    int *val, char **optarg, int *optidx)
{
	const nng_arg_spec *spec;
	int                 matches;
	bool                shortopt;
	size_t              l;
	char               *arg;
	int                 i;

	if ((i = *optidx) >= argc) {
		return (-1);
	}
	arg = argv[*optidx];

	if (arg[0] != '-') {
		return (-1);
	}
	if (arg[1] == '\0') {
		*optidx = i + 1;
		return (-1);
	}

	if ((arg[0] == '-') && (arg[1] == '-')) {
		arg += 2;
		shortopt = false;
		for (l = 0; arg[l] != '\0'; l++) {
			if ((arg[l] == '=') || (arg[l] == ':')) {
				break;
			}
		}
	} else {
		arg++;
		shortopt = true;
		l        = 1;
	}

	matches = 0;
	spec    = NULL;

	for (int x = 0; specs[x].a_val != 0; x++) {

		if (shortopt) {
			if (arg[0] == specs[x].a_short) {
				matches = 1;
				spec    = &specs[x];
				break;
			}
			continue;
		}

		if ((specs[x].a_name == NULL) ||
		    (strncmp(arg, specs[x].a_name, l) != 0)) {
			continue;
		}
		matches++;
		spec = &specs[x];

		if (strlen(specs[x].a_name) == l) {
			// Perfect match.
			matches = 1;
			break;
		}
	}

	switch (matches) {
	case 1:
		// Exact match
		break;
	case 0:
		// No such option
		return (NNG_ARG_INVAL);
		break;
	default:
		// Ambiguous (not match)
		return (NNG_ARG_AMBIG);
		break;
	}

	if (!spec->a_arg) {
		// No option clustering for short options yet.
		if (arg[l] != '\0') {
			return (NNG_ARG_INVAL);
		}
		*val    = spec->a_val;
		*optidx = i + 1;
		return (0);
	}

	if (arg[l] != '\0') {
		if (shortopt) {
			*optarg = arg + l;
		} else {
			*optarg = arg + l + 1;
		}
	} else {
		i++;
		if (i >= argc) {
			return (NNG_ARG_MISSING);
		}
		*optarg = argv[i];
	}
	*optidx = ++i;
	*val    = spec->a_val;

	return (0);
}